

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckAttrValidity(TidyDocImpl *doc,Node *node,AttVal *attval,ctmbstr *list)

{
  Bool BVar1;
  ctmbstr *list_local;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else {
    CheckLowerCaseAttrValue(doc,node,attval);
    BVar1 = AttrValueIsAmong(attval,list);
    if (BVar1 == no) {
      prvTidyReportAttrError(doc,node,attval,0x22b);
    }
  }
  return;
}

Assistant:

static void CheckAttrValidity( TidyDocImpl* doc, Node *node, AttVal *attval,
                               ctmbstr const list[])
{
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval );

    if (!AttrValueIsAmong(attval, list))
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}